

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::recordSinglePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkResult VVar1;
  VkDevice device;
  DeviceInterface *vk;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  VkCommandBufferAllocateInfo cmdBufParams;
  VkCommandPoolCreateInfo cmdPoolParams;
  allocator<char> local_f9;
  RefBase<vk::VkCommandBuffer_s_*> local_f8;
  string local_d8;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_b8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_98;
  RefBase<vk::VkCommandBuffer_s_*> local_78;
  Handle<(vk::HandleType)24> local_58;
  DeviceInterface *pDStack_50;
  VkCommandPool local_48;
  VkAllocationCallbacks *pVStack_40;
  VkCommandPoolCreateInfo local_38;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_38.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_38.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_38.pNext = (void *)0x0;
  local_38.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_58,vk,device,&local_38,
             (VkAllocationCallbacks *)0x0);
  local_98.m_data.deleter.m_device = (VkDevice)local_48.m_internal;
  local_98.m_data.deleter.m_allocator = pVStack_40;
  local_98.m_data.object.m_internal = local_58.m_internal;
  local_98.m_data.deleter.m_deviceIface = pDStack_50;
  local_58.m_internal = 0;
  pDStack_50 = (DeviceInterface *)0x0;
  local_48.m_internal = 0;
  pVStack_40 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_58);
  local_58.m_internal._0_4_ = 0x28;
  pDStack_50 = (DeviceInterface *)0x0;
  local_48.m_internal = local_98.m_data.object.m_internal;
  pVStack_40 = (VkAllocationCallbacks *)&DAT_100000000;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_78,vk,device,
             (VkCommandBufferAllocateInfo *)&local_58);
  local_f8.m_data.deleter.m_device = local_78.m_data.deleter.m_device;
  local_f8.m_data.deleter.m_pool.m_internal = local_78.m_data.deleter.m_pool.m_internal;
  local_f8.m_data.object = local_78.m_data.object;
  local_f8.m_data.deleter.m_deviceIface = local_78.m_data.deleter.m_deviceIface;
  local_78.m_data.object = (VkCommandBuffer_s *)0x0;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_78);
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_pool.m_internal = 0;
  local_78.m_data.object = (VkCommandBuffer_s *)0x2a;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&local_d8,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_b8.m_data.deleter.m_device = (VkDevice)local_d8.field_2._M_allocated_capacity;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_d8.field_2._8_8_;
  local_b8.m_data.object.m_internal = (deUint64)local_d8._M_dataplus._M_p;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_d8._M_string_length;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_d8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)10>_> *)&local_d8);
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_f8.m_data.object,&local_78);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x544);
  (*vk->_vptr_DeviceInterface[0x6a])
            (vk,local_f8.m_data.object,local_b8.m_data.object.m_internal,0x10000);
  VVar1 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_f8.m_data.object);
  ::vk::checkResult(VVar1,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x549);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Primary buffer recorded successfully.",&local_f9);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_b8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_f8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus recordSinglePrimaryBufferTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		0,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// create event that will be used to check if secondary command buffer has been executed
	const Unique<VkEvent>					event					(createEvent(vk, vkDevice));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// record setting event
		vk.cmdSetEvent(*primCmdBuf, *event, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	return tcu::TestStatus::pass("Primary buffer recorded successfully.");
}